

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthStateMonitor.cpp
# Opt level: O0

void __thiscall PatchNameButton::handleClicked(PatchNameButton *this)

{
  bool bVar1;
  qsizetype qVar2;
  const_reference pSVar3;
  QString *pQVar4;
  QVariant *pQVar5;
  QRect *this_00;
  QVariant local_158;
  undefined1 local_138 [8];
  Item item_1;
  undefined8 local_108;
  long local_100;
  QAction *triggeredAction;
  QString local_d8;
  QString local_c0;
  undefined1 local_a8 [8];
  QString timbreName;
  Item *item;
  int itemIx;
  QVector<SoundGroup::Item> *items;
  SoundGroup *group;
  int groupIx;
  QMenu *groupMenu;
  QMenu menu;
  undefined1 local_28 [8];
  QVector<SoundGroup> groups;
  PatchNameButton *this_local;
  
  groups.d.size = (qsizetype)this;
  QList<SoundGroup>::QList((QList<SoundGroup> *)local_28);
  SynthRoute::getSoundGroups(this->synthRoute,(QList<SoundGroup> *)local_28);
  QMenu::QMenu((QMenu *)&groupMenu,(QWidget *)this);
  for (group._4_4_ = 0; qVar2 = QList<SoundGroup>::size((QList<SoundGroup> *)local_28),
      group._4_4_ < qVar2; group._4_4_ = group._4_4_ + 1) {
    pSVar3 = QList<SoundGroup>::at((QList<SoundGroup> *)local_28,(long)group._4_4_);
    pQVar4 = (QString *)QMenu::addMenu((QString *)&groupMenu);
    for (item._4_4_ = 0; qVar2 = QList<SoundGroup::Item>::size(&pSVar3->constituents),
        item._4_4_ < qVar2; item._4_4_ = item._4_4_ + 1) {
      timbreName.d.size =
           (qsizetype)QList<SoundGroup::Item>::at(&pSVar3->constituents,(long)item._4_4_);
      QString::trimmed((QString *)local_a8,&((const_reference)timbreName.d.size)->timbreName);
      bVar1 = QString::isEmpty((QString *)local_a8);
      if (bVar1) {
        QString::number((uint)&local_d8,(uint)(*(byte *)timbreName.d.size >> 2));
        ::operator+(&local_c0,"Memory Timbre #",&local_d8);
        QString::operator=((QString *)local_a8,(QString *)&local_c0);
        QString::~QString(&local_c0);
        QString::~QString(&local_d8);
      }
      pQVar5 = (QVariant *)QMenu::addAction(pQVar4);
      QVariant::fromValue<SoundGroup::Item>
                ((enable_if_t<std::is_copy_constructible_v<SoundGroup::Item>,_QVariant> *)
                 &triggeredAction,(Item *)timbreName.d.size);
      QAction::setData(pQVar5);
      QVariant::~QVariant((QVariant *)&triggeredAction);
      QString::~QString((QString *)local_a8);
    }
  }
  this_00 = QWidget::geometry((QWidget *)this);
  item_1.timbreName.d.size = (qsizetype)QRect::bottomLeft(this_00);
  QWidget::mapFromParent((QPoint *)this);
  local_108 = QWidget::mapToGlobal((QPoint *)this);
  local_100 = QMenu::exec((QPoint *)&groupMenu,(QAction *)&local_108);
  if (local_100 != 0) {
    QAction::data();
    QVariant::value<SoundGroup::Item>((Item *)local_138,&local_158);
    QVariant::~QVariant(&local_158);
    SynthRoute::setTimbreOnPart
              (this->synthRoute,this->partNumber,local_138[0] & 3,(uint)(local_138[0] >> 2));
    SoundGroup::Item::~Item((Item *)local_138);
  }
  QMenu::~QMenu((QMenu *)&groupMenu);
  QList<SoundGroup>::~QList((QList<SoundGroup> *)local_28);
  return;
}

Assistant:

void PatchNameButton::handleClicked() {
	QVector<SoundGroup> groups;
	synthRoute.getSoundGroups(groups);

	QMenu menu(this);
	QMenu *groupMenu = NULL;
	for (int groupIx = 0; groupIx < groups.size(); groupIx++) {
		const SoundGroup &group = groups.at(groupIx);
		groupMenu = menu.addMenu(group.name);
		const QVector<SoundGroup::Item> &items = group.constituents;
		for (int itemIx = 0; itemIx < items.size(); itemIx++) {
			const SoundGroup::Item &item = items.at(itemIx);
			QString timbreName = item.timbreName.trimmed();
			if (timbreName.isEmpty()) {
				timbreName = "Memory Timbre #" + QString::number(item.timbreNumber);
			}
			groupMenu->addAction(timbreName)->setData(QVariant::fromValue(item));
		}
	}
	QAction *triggeredAction = menu.exec(mapToGlobal(mapFromParent(geometry().bottomLeft())));
	if (triggeredAction != NULL) {
		SoundGroup::Item item = triggeredAction->data().value<SoundGroup::Item>();
		synthRoute.setTimbreOnPart(partNumber, item.timbreGroup, item.timbreNumber);
	}
}